

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O1

bool TestMotorPowerControl(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  char cVar1;
  byte bVar2;
  uint32_t uVar3;
  int row;
  uint32_t uVar4;
  ostream *poVar5;
  uint uVar6;
  uint uVar7;
  int row_00;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  char buf [100];
  uint local_b8;
  byte local_98 [104];
  
  AmpIO::WriteWatchdogPeriod(Board,0);
  cVar1 = (char)logFile;
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=== Motor Power Control ===",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  bVar15 = qlaNum == 2;
  uVar6 = 0xc0f0f;
  if (bVar15) {
    uVar6 = 0x48000;
  }
  uVar7 = 0xc0000;
  if (bVar15) {
    uVar7 = 0x48000;
  }
  uVar11 = 0x4ffff;
  if (bVar15) {
    uVar11 = 0x8000;
  }
  uVar13 = 0x40000;
  if (bVar15) {
    uVar13 = 0x8000;
  }
  if (qlaNum == 1) {
    uVar6 = 0x44000;
    uVar7 = 0x44000;
    uVar11 = 0x4000;
    uVar13 = 0x4000;
  }
  iVar10 = (uint)bVar15 * 4;
  bVar15 = true;
  bVar2 = 0;
  do {
    AmpIO::WritePowerEnable(Board,true);
    Amp1394Console::Print(curLine,9,"Enable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    (*Port->_vptr_BasePort[0x1d])();
    uVar3 = AmpIO::GetStatus(Board);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Enable motor power: ",0x17);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    if ((uVar3 & uVar6) == uVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - PASS",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      sprintf((char *)local_98,"PASS (%08lx)",(ulong)uVar3);
      iVar14 = curLine;
LAB_001075f6:
      row = iVar14 + 1;
      Amp1394Console::Print(iVar14,0x1e,(char *)local_98);
      uVar4 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
      row_00 = row;
      if (((uVar3 & uVar11) == uVar13) && (!bVar15)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   Continuing test, ignoring \'motor voltage good\' feedback"
                   ,0x3a);
        std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        row_00 = iVar14 + 2;
        Amp1394Console::Print(row,9,"Continuing test, ignoring \'motor voltage good\' feedback");
        bVar2 = 1;
      }
      Amp1394Console::Refresh();
      if (uVar4 < 8) {
        AmpIO::WriteAmpEnable(Board,0xf,0xf);
      }
      else {
        iVar14 = 0;
        do {
          AmpIO::WriteAmpEnableAxis(Board,iVar14 + iVar10,true);
          iVar14 = iVar14 + 1;
        } while (iVar14 != 4);
      }
      Amp1394_Sleep(0.006);
      (*Port->_vptr_BasePort[0x1d])();
      if (uVar4 < 8) {
        uVar3 = AmpIO::GetStatus(Board);
        uVar8 = (ulong)uVar3;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   Amplifier enable: ",0x15);
        *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
             *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        local_b8 = ((byte)~bVar2 & 1) << 0x13 | 0x40f0f;
        if ((local_b8 & ~uVar3) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - PASS",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          pcVar12 = "Enable power amplifiers - PASS (%08lx)";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - FAIL",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          bVar15 = false;
          pcVar12 = "Enable power amplifiers - FAIL (%08lx)";
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   Amplifier enable: ",0x15);
        uVar8 = 0;
        iVar14 = 0;
        do {
          bVar16 = AmpIO::GetAmpEnable(Board,iVar14 + iVar10);
          if (bVar16) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"1 ",2);
            uVar8 = uVar8 | (uint)(1 << ((byte)iVar14 & 0x1f));
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"0 ",2);
            bVar15 = false;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 != 4);
        if (uVar8 == 0xf) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - PASS",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          uVar8 = 0xf;
          pcVar12 = "Enable power amplifiers - PASS (%04lx)";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - FAIL",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          pcVar12 = "Enable power amplifiers - FAIL (%04lx)";
        }
      }
      sprintf((char *)local_98,pcVar12,uVar8);
      Amp1394Console::Print(row_00,9,(char *)local_98);
      Amp1394Console::Refresh();
      Amp1394_Sleep(1.0);
      if (uVar4 < 8) {
        AmpIO::WriteAmpEnable(Board,0xf,0);
      }
      else {
        iVar14 = 0;
        do {
          AmpIO::WriteAmpEnableAxis(Board,iVar14 + iVar10,false);
          iVar14 = iVar14 + 1;
        } while (iVar14 != 4);
      }
      Amp1394_Sleep(0.001);
      (*Port->_vptr_BasePort[0x1d])();
      if (uVar4 < 8) {
        uVar3 = AmpIO::GetStatus(Board);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   Amplifier disable: ",0x16);
        *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
             *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        if ((local_b8 & (uVar3 ^ 0xc0000)) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - PASS",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          pcVar12 = "Disable power amplifiers - PASS (%08lx)";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - FAIL",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          bVar15 = false;
          pcVar12 = "Disable power amplifiers - FAIL (%08lx)";
        }
        sprintf((char *)local_98,pcVar12,(ulong)uVar3);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   Amplifier disable: ",0x16);
        uVar8 = 0;
        iVar14 = 0;
        do {
          bVar16 = AmpIO::GetAmpEnable(Board,iVar14 + iVar10);
          if (bVar16) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"1 ",2);
            uVar8 = uVar8 | (uint)(1 << ((byte)iVar14 & 0x1f));
            bVar15 = false;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"0 ",2);
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 != 4);
        if (uVar8 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - PASS",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          pcVar12 = "Disable power amplifiers - PASS (%04lx)";
          uVar8 = 0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - FAIL",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          pcVar12 = "Disable power amplifiers - FAIL (%04lx)";
        }
        sprintf((char *)local_98,pcVar12,uVar8);
      }
      Amp1394Console::Print(row_00 + 1,9,(char *)local_98);
      AmpIO::WritePowerEnable(Board,false);
      Amp1394Console::Print(row_00 + 2,9,"Disable motor power -");
      Amp1394Console::Refresh();
      Amp1394_Sleep(1.0);
      (*Port->_vptr_BasePort[0x1d])(Port);
      uVar3 = AmpIO::GetStatus(Board);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"   Disable motor power: ",0x18);
      *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
           *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      bVar16 = (uVar6 & uVar3) == 0;
      pcVar12 = " - FAIL";
      if (bVar16) {
        pcVar12 = " - PASS";
      }
      pcVar9 = "Enable power amplifiers - FAIL (%08lx)";
      if (bVar16) {
        pcVar9 = "Enable power amplifiers - PASS (%08lx)";
      }
      else {
        bVar15 = false;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar12,7);
      std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      sprintf((char *)local_98,pcVar9 + 0x1a,(ulong)uVar3);
      curLine = row_00 + 3;
      Amp1394Console::Print(row_00 + 2,0x1f,(char *)local_98);
      if (qlaNum == 0) {
        AmpIO::WriteSafetyRelay(Board,true);
        Amp1394_Sleep(0.01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   Enable safety relay: ",0x18);
        *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
             *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
        BoardIO::ReadStatus((BoardIO *)Board);
        std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        bVar16 = AmpIO::ReadSafetyRelayStatus(Board);
        pcVar12 = " - FAIL";
        if (bVar16) {
          pcVar12 = " - PASS";
        }
        pcVar9 = "Enable safety relay - FAIL (%08x)";
        if (bVar16) {
          pcVar9 = "Enable safety relay - PASS (%08x)";
        }
        if (!bVar16) {
          bVar15 = false;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar12,7);
        std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        uVar3 = BoardIO::ReadStatus((BoardIO *)Board);
        sprintf((char *)local_98,pcVar9,(ulong)uVar3);
        Amp1394Console::Print(curLine,9,(char *)local_98);
        Amp1394Console::Refresh();
        Amp1394_Sleep(1.0);
        AmpIO::WriteSafetyRelay(Board,false);
        Amp1394_Sleep(0.001);
        (*Port->_vptr_BasePort[0x1d])();
        uVar3 = AmpIO::GetStatus(Board);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   Disable safety relay: ",0x19);
        *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
             *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        bVar16 = (uVar3 & 0x30000) == 0;
        pcVar12 = " - FAIL";
        if (bVar16) {
          pcVar12 = " - PASS";
        }
        pcVar9 = "Disable safety relay - FAIL (%08lx)";
        if (bVar16) {
          pcVar9 = "Disable safety relay - PASS (%08lx)";
        }
        else {
          bVar15 = false;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar12,7);
        std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        sprintf((char *)local_98,pcVar9,(ulong)uVar3);
        curLine = row_00 + 5;
        Amp1394Console::Print(row_00 + 4,9,(char *)local_98);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   Skipping safety relay tests for DQLA",0x27);
        std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      AmpIO::WriteWatchdogPeriod(Board,0xffff);
      bVar16 = false;
    }
    else {
      sprintf((char *)local_98,"FAIL (%08lx) - is motor power connected?",(ulong)uVar3);
      iVar14 = curLine + 1;
      Amp1394Console::Print(curLine,0x1e,(char *)local_98);
      Amp1394Console::Print(iVar14,9,"Do you want to retry (y/n)? ");
      Amp1394Console::GetString((char *)local_98,100);
      if ((local_98[0] & 0xdf) != 0x59) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - FAIL",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        bVar15 = false;
        goto LAB_001075f6;
      }
      Amp1394Console::Print(iVar14,9,"                               ");
      Amp1394Console::Print(curLine,0x1e,"                                           ");
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," - Retrying",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      bVar16 = true;
    }
    if (!bVar16) {
      return bVar15;
    }
  } while( true );
}

Assistant:

bool TestMotorPowerControl(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    char buf[100];
    unsigned long status;
    bool pass = true;
    bool ignoreMV = false;     // ignore "motor voltage good" feedback
    unsigned long mask;

    // Disable watchdog
    Board.WriteWatchdogPeriod(0x0000);

    logFile << std::endl << "=== Motor Power Control ===" << std::endl;
 retry:
    // Enabling motor power supply
    Board.WritePowerEnable(true);
    Amp1394Console::Print(curLine, 9, "Enable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    Port->ReadAllBoards();
    status = Board.GetStatus();
    logFile << "   Enable motor power: " << std::hex << status;
    // Note: QLA implementation also verifies that amp enable is off
    uint32_t status_mask = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0f0f;
    uint32_t status_goal = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0000;
    if ((status & status_mask) != status_goal) {
        sprintf(buf, "FAIL (%08lx) - is motor power connected?", status);
        Amp1394Console::Print(curLine++, 30, buf);
        Amp1394Console::Print(curLine, 9, "Do you want to retry (y/n)? ");
        Amp1394Console::GetString(buf, sizeof(buf));
        if ((buf[0] == 'y') || (buf[0] == 'Y')) {
            Amp1394Console::Print(curLine, 9, "                               ");
            curLine -= 1;
            Amp1394Console::Print(curLine, 30, "                                           ");
            logFile << " - Retrying" << std::endl;
            goto retry;
        }
        logFile << " - FAIL" << std::endl;
        pass = false;
    }
    else {
        logFile << " - PASS" << std::endl;
        sprintf(buf, "PASS (%08lx)", status);
    }
    Amp1394Console::Print(curLine++, 30, buf);

    uint32_t fver = Board.GetFirmwareVersion();

    status_mask = (qlaNum == 1) ? 0x00004000 : (qlaNum == 2) ? 0x00008000 : 0x0004ffff;
    status_goal = (qlaNum == 1) ? 0x00004000 : (qlaNum == 2) ? 0x00008000 : 0x00040000;
    if (!pass && (status & status_mask) == status_goal) {
        logFile << "   Continuing test, ignoring 'motor voltage good' feedback" << std::endl;
        Amp1394Console::Print(curLine++, 9, "Continuing test, ignoring 'motor voltage good' feedback");
        ignoreMV = true;
    }
    Amp1394Console::Refresh();

    unsigned int i;
    unsigned int motorStart = (qlaNum == 2) ? 4 : 0;

    // Enabling individual amplifiers
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0x0f);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, true);
    }
    Amp1394_Sleep(0.006);       // QLA Rev 1.5+ may have delay up to 5.3 ms
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        logFile << "   Amplifier enable: " << std::hex << status;
        mask = ignoreMV ? 0x00040f0f : 0x000c0f0f;
        if ((status&mask) != (0x000c0f0f&mask)) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Enable power amplifiers - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable power amplifiers - PASS (%08lx)", status);
        }
    }
    else {
        logFile << "   Amplifier enable: ";
        status = 0;
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (motorEn) {
                logFile << "1 ";
                status |= (1 << i);
            }
            else {
                logFile << "0 ";
                pass = false;
            }
        }
        if (status != 0x000f) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Enable power amplifiers - FAIL (%04lx)", status);
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable power amplifiers - PASS (%04lx)", status);
        }
    }
    Amp1394Console::Print(curLine++, 9, buf);

    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);    // wait 1 second (LEDs should be ON)

    // Turning amplifiers off
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, false);
    }
    Amp1394_Sleep(0.001);
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        logFile << "   Amplifier disable: " << std::hex << status;
        if ((status&mask) != (0x000c0000&mask)) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable power amplifiers - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable power amplifiers - PASS (%08lx)", status);
        }
    }
    else {
        logFile << "   Amplifier disable: ";
        status = 0;
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (motorEn) {
                logFile << "1 ";
                status |= (1 << i);
                pass = false;
            }
            else {
                logFile << "0 ";
            }
        }
        if (status != 0) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable power amplifiers - FAIL (%04lx)", status);
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable power amplifiers - PASS (%04lx)", status);
        }
    }
    Amp1394Console::Print(curLine++, 9, buf);

    Board.WritePowerEnable(false);
    Amp1394Console::Print(curLine, 9, "Disable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    Port->ReadAllBoards();
    status = Board.GetStatus();
    logFile << "   Disable motor power: " << std::hex << status;
    status_mask = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0f0f;
    if ((status&status_mask) != 0) {
        logFile << " - FAIL" << std::endl;
        sprintf(buf, "FAIL (%08lx)", status);
        pass = false;
    }
    else {
        logFile << " - PASS" << std::endl;
        sprintf(buf, "PASS (%08lx)", status);
    }
    Amp1394Console::Print(curLine++, 31, buf);

    if (qlaNum == 0) {
        // Turn on safety relay
        Board.WriteSafetyRelay(true);
        Amp1394_Sleep(0.01);   // 10 ms
        logFile << "   Enable safety relay: " << std::hex << Board.ReadStatus();
        if (!Board.ReadSafetyRelayStatus()) {
            logFile << " - FAIL" << std::endl;
            // Old QLA boards (before Rev 1.3) require +12V to be connected to relay
            sprintf(buf, "Enable safety relay - FAIL (%08x)", Board.ReadStatus());
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable safety relay - PASS (%08x)", Board.ReadStatus());
        }
        Amp1394Console::Print(curLine++, 9, buf);

        Amp1394Console::Refresh();
        Amp1394_Sleep(1.0);

        // Turn off safety relay
        Board.WriteSafetyRelay(false);
        Amp1394_Sleep(0.001);
        Port->ReadAllBoards();
        status = Board.GetStatus();
        logFile << "   Disable safety relay: " << std::hex << status;
        if ((status&0x00030000) != 0) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable safety relay - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable safety relay - PASS (%08lx)", status);
        }
        Amp1394Console::Print(curLine++, 9, buf);
    }
    else {
        logFile << "   Skipping safety relay tests for DQLA" << std::endl;
    }

    // Reenable watchdog
    Board.WriteWatchdogPeriod(0xFFFF);

    return pass;
}